

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::action_provider<clipp::parameter>::execute_actions
          (action_provider<clipp::parameter> *this,arg_string *arg)

{
  bool bVar1;
  reference this_00;
  char *__args;
  function<void_(const_char_*)> *a;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  *__range3;
  int i;
  arg_string *arg_local;
  action_provider<clipp::parameter> *this_local;
  
  __end3 = std::
           vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
           ::begin(&this->argActions_);
  a = (function<void_(const_char_*)> *)
      std::
      vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
      ::end(&this->argActions_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::function<void_(const_char_*)>_*,_std::vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>_>
                                *)&a);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::function<void_(const_char_*)>_*,_std::vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>_>
              ::operator*(&__end3);
    __args = (char *)std::__cxx11::string::c_str();
    std::function<void_(const_char_*)>::operator()(this_00,__args);
    __gnu_cxx::
    __normal_iterator<const_std::function<void_(const_char_*)>_*,_std::vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void execute_actions(const arg_string& arg) const {
        int i = 0;
        for(const auto& a : argActions_) {
            ++i;
            a(arg.c_str());
        }
    }